

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::android::testNoLayers(TestStatus *__return_storage_ptr__,Context *context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestLog *log;
  TestStatus *pTVar2;
  Context *this;
  qpTestResult qVar3;
  long *plVar4;
  InstanceInterface *vki;
  VkPhysicalDevice physicalDevice;
  size_type *psVar5;
  pointer pVVar6;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> layers;
  ResultCollector results;
  string local_e8;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> local_c8;
  long *local_b0 [2];
  long local_a0 [2];
  TestStatus *local_90;
  Context *local_88;
  ResultCollector local_80;
  
  log = context->m_testCtx->m_log;
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
  tcu::ResultCollector::ResultCollector(&local_80,log,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_90 = __return_storage_ptr__;
  local_88 = context;
  ::vk::enumerateInstanceLayerProperties(&local_c8,context->m_platformInterface);
  if (local_c8.super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_c8.super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pVVar6 = local_c8.
             super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,"Instance layer enumerated: ","");
      plVar4 = (long *)std::__cxx11::string::append((char *)local_b0);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_e8.field_2._M_allocated_capacity = *psVar5;
        local_e8.field_2._8_8_ = plVar4[3];
        local_e8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar5;
        local_e8._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_e8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      tcu::ResultCollector::fail(&local_80,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      pVVar6 = pVVar6 + 1;
    } while (pVVar6 != local_c8.
                       super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_c8.super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  this = local_88;
  vki = Context::getInstanceInterface(local_88);
  physicalDevice = Context::getPhysicalDevice(this);
  ::vk::enumerateDeviceLayerProperties(&local_c8,vki,physicalDevice);
  if (local_c8.super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_c8.super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pVVar6 = local_c8.
             super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,"Device layer enumerated: ","");
      plVar4 = (long *)std::__cxx11::string::append((char *)local_b0);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_e8.field_2._M_allocated_capacity = *psVar5;
        local_e8.field_2._8_8_ = plVar4[3];
        local_e8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar5;
        local_e8._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_e8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      tcu::ResultCollector::fail(&local_80,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      pVVar6 = pVVar6 + 1;
    } while (pVVar6 != local_c8.
                       super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_c8.super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  qVar3 = tcu::ResultCollector::getResult(&local_80);
  pTVar2 = local_90;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_80.m_message._M_dataplus._M_p,
             local_80.m_message._M_dataplus._M_p + local_80.m_message._M_string_length);
  pTVar2->m_code = qVar3;
  (pTVar2->m_description)._M_dataplus._M_p = (pointer)&(pTVar2->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar2->m_description,local_e8._M_dataplus._M_p,
             local_e8._M_dataplus._M_p + local_e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return pTVar2;
}

Assistant:

tcu::TestStatus testNoLayers (Context& context)
{
	TestLog&				log		= context.getTestContext().getLog();
	tcu::ResultCollector	results	(log);

	{
		const vector<VkLayerProperties>	layers	= enumerateInstanceLayerProperties(context.getPlatformInterface());

		for (vector<VkLayerProperties>::const_iterator layer = layers.begin(); layer != layers.end(); ++layer)
			results.fail(string("Instance layer enumerated: ") + layer->layerName);
	}

	{
		const vector<VkLayerProperties>	layers	= enumerateDeviceLayerProperties(context.getInstanceInterface(), context.getPhysicalDevice());

		for (vector<VkLayerProperties>::const_iterator layer = layers.begin(); layer != layers.end(); ++layer)
			results.fail(string("Device layer enumerated: ") + layer->layerName);
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}